

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O1

void __thiscall
EfcFlash::EfcFlash(EfcFlash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,
                  uint32_t size,uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack,
                  bool canBootFlash)

{
  Flash::Flash(&this->super_Flash,samba,name,addr,pages,size,planes,lockRegions,user,stack);
  (this->super_Flash)._vptr_Flash = (_func_int **)&PTR__EfcFlash_00119a80;
  (this->super_Flash).field_0xf4 = canBootFlash;
  if (1 < planes - 1) {
    __assert_fail("planes == 1 || planes == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                  ,0x43,
                  "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  if (pages <= planes << 10) {
    if (lockRegions < 0x21) {
      eraseAuto(this,true);
      return;
    }
    __assert_fail("lockRegions <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                  ,0x45,
                  "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  __assert_fail("pages <= planes * 1024",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EfcFlash.cpp"
                ,0x44,
                "EfcFlash::EfcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
               );
}

Assistant:

EfcFlash::EfcFlash(Samba& samba,
                   const std::string& name,
                   uint32_t addr,
                   uint32_t pages,
                   uint32_t size,
                   uint32_t planes,
                   uint32_t lockRegions,
                   uint32_t user,
                   uint32_t stack,
                   bool canBootFlash)
    : Flash(samba, name, addr, pages, size, planes, lockRegions, user, stack),
      _canBootFlash(canBootFlash)
{
    assert(planes == 1 || planes == 2);
    assert(pages <= planes * 1024);
    assert(lockRegions <= 32);

    eraseAuto(true);
}